

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O2

void __thiscall
Refal2::CUnitList::HandyPrint(CUnitList *this,ostream *outputStream,CPrintHelper *printHelper)

{
  CNodeType *pCVar1;
  bool bVar2;
  bool bVar3;
  TUnitType TVar4;
  ostream *poVar5;
  char *pcVar6;
  CNodeType **ppCVar7;
  
  ppCVar7 = &(this->super_CNodeList<Refal2::CUnit>).first;
  bVar2 = false;
  do {
    pCVar1 = *ppCVar7;
    if (pCVar1 == (CNodeType *)0x0) {
      if (!bVar2) {
        return;
      }
      std::operator<<(outputStream,"\'");
      return;
    }
    TVar4 = (pCVar1->super_CUnit).type;
    if (TVar4 == UT_Char) {
      bVar3 = true;
      if (!bVar2) {
LAB_00135719:
        bVar2 = bVar3;
        std::operator<<(outputStream,"\'");
        TVar4 = (pCVar1->super_CUnit).type;
        goto LAB_0013572a;
      }
LAB_00135757:
      std::operator<<(outputStream,(pCVar1->super_CUnit).field_1.c);
    }
    else {
      if (bVar2) {
        bVar3 = false;
        goto LAB_00135719;
      }
LAB_0013572a:
      poVar5 = outputStream;
      if (TVar4 == UT_RightBracket) {
        pcVar6 = ">";
      }
      else {
        if (TVar4 == UT_Label) {
          std::operator<<(outputStream,"/");
          (*printHelper->_vptr_CPrintHelper[1])
                    (printHelper,outputStream,(ulong)(pCVar1->super_CUnit).field_1.number);
        }
        else {
          if (TVar4 != UT_Number) {
            if (TVar4 == UT_LeftParen) {
              pcVar6 = "(";
            }
            else if (TVar4 == UT_RightParen) {
              pcVar6 = ")";
            }
            else {
              if (TVar4 != UT_LeftBracket) {
                if (TVar4 != UT_Char) {
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                                ,0xa1,
                                "void Refal2::CUnitList::HandyPrint(std::ostream &, const CPrintHelper &) const"
                               );
                }
                goto LAB_00135757;
              }
              pcVar6 = "<";
            }
            goto LAB_001357e4;
          }
          poVar5 = std::operator<<(outputStream,"/");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        }
        pcVar6 = "/";
      }
LAB_001357e4:
      std::operator<<(poVar5,pcVar6);
    }
    ppCVar7 = &pCVar1->next;
  } while( true );
}

Assistant:

void CUnitList::HandyPrint( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	bool lastWasChar = false;
	for( const CUnitNode* node = GetFirst(); node != 0; node = node->Next() ) {
		if( node->GetType() == UT_Char ) {
			if( !lastWasChar ) {
				outputStream << "'";
				lastWasChar = true;
			}
		} else {
			if( lastWasChar ) {
				outputStream << "'";
				lastWasChar = false;
			}
		}
		switch( node->GetType() ) {
			case UT_Char:
				outputStream << node->Char();
				break;
			case UT_Label:
				outputStream << "/";
				printHelper.Label( outputStream, node->Label() );
				outputStream << "/";
				break;
			case UT_Number:
				outputStream << "/" << node->Number() << "/";
				break;
			case UT_LeftParen:
				outputStream << "(";
				break;
			case UT_RightParen:
				outputStream << ")";
				break;
			case UT_LeftBracket:
				outputStream << "<";
				break;
			case UT_RightBracket:
				outputStream << ">";
				break;
			case UT_Variable:
			default:
				assert( false );
				break;
		}
	}
	if( lastWasChar ) {
		outputStream << "'";
	}
}